

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

int String::compare(char *s1,char *s2,usize len)

{
  char *end1;
  usize len_local;
  char *s2_local;
  char *s1_local;
  
  len_local = (usize)s2;
  s2_local = s1;
  while( true ) {
    if (s1 + len <= s2_local) {
      return 0;
    }
    if ((*s2_local == '\0') || (*s2_local != *(char *)len_local)) break;
    s2_local = s2_local + 1;
    len_local = len_local + 1;
  }
  return (uint)(byte)*s2_local - (uint)*(byte *)len_local;
}

Assistant:

static int compare(const char* s1, const char* s2, usize len)
  {
    for(const char* end1 = s1 + len; s1 < end1; ++s1, ++s2)
      if(!*s1 || *s1 != *s2)
        return (int)*(const uchar*)s1 - *(const uchar*)s2;
    return 0;
  }